

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStandardLevelResolver.cxx
# Opt level: O2

cmValue __thiscall
cmStandardLevelResolver::CompileFeaturesAvailable
          (cmStandardLevelResolver *this,string *lang,string *error)

{
  cmMakefile *pcVar1;
  bool bVar2;
  cmGlobalGenerator *this_00;
  cmValue cVar3;
  ostream *poVar4;
  string *psVar5;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  ostringstream e;
  
  this_00 = cmMakefile::GetGlobalGenerator(this->Makefile);
  bVar2 = cmGlobalGenerator::GetLanguageEnabled(this_00,lang);
  if (bVar2) {
    pcVar1 = this->Makefile;
    std::operator+(&local_220,"CMAKE_",lang);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                   &local_220,"_COMPILE_FEATURES");
    cVar3 = cmMakefile::GetDefinition(pcVar1,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::~string((string *)&local_220);
    if ((cVar3.Value != (string *)0x0) && ((cVar3.Value)->_M_string_length != 0)) {
      return (cmValue)cVar3.Value;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    pcVar6 = "no";
    if (error == (string *)0x0) {
      pcVar6 = "No";
    }
    std::operator<<((ostream *)&e,pcVar6);
    poVar4 = std::operator<<((ostream *)&e," known features for ");
    poVar4 = std::operator<<(poVar4,(string *)lang);
    poVar4 = std::operator<<(poVar4," compiler\n\"");
    pcVar1 = this->Makefile;
    std::operator+(&local_1c0,"CMAKE_",lang);
    std::operator+(&local_220,&local_1c0,"_COMPILER_ID");
    psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_220);
    poVar4 = std::operator<<(poVar4,(string *)psVar5);
    poVar4 = std::operator<<(poVar4,"\"\nversion ");
    pcVar1 = this->Makefile;
    std::operator+(&local_200,"CMAKE_",lang);
    std::operator+(&local_1e0,&local_200,"_COMPILER_VERSION");
    psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_1e0);
    poVar4 = std::operator<<(poVar4,(string *)psVar5);
    std::operator<<(poVar4,".");
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1c0);
    if (error == (string *)0x0) {
      pcVar1 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_220);
      goto LAB_0026ef6b;
    }
    std::__cxx11::stringbuf::str();
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    pcVar6 = "cannot";
    if (error == (string *)0x0) {
      pcVar6 = "Cannot";
    }
    std::operator<<((ostream *)&e,pcVar6);
    poVar4 = std::operator<<((ostream *)&e," use features from non-enabled language ");
    std::operator<<(poVar4,(string *)lang);
    if (error == (string *)0x0) {
      pcVar1 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_220);
      goto LAB_0026ef6b;
    }
    std::__cxx11::stringbuf::str();
  }
  std::__cxx11::string::operator=((string *)error,(string *)&local_220);
LAB_0026ef6b:
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return (cmValue)(string *)0x0;
}

Assistant:

cmValue cmStandardLevelResolver::CompileFeaturesAvailable(
  const std::string& lang, std::string* error) const
{
  if (!this->Makefile->GetGlobalGenerator()->GetLanguageEnabled(lang)) {
    std::ostringstream e;
    if (error) {
      e << "cannot";
    } else {
      e << "Cannot";
    }
    e << " use features from non-enabled language " << lang;
    if (error) {
      *error = e.str();
    } else {
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    }
    return nullptr;
  }

  cmValue featuresKnown =
    this->Makefile->GetDefinition("CMAKE_" + lang + "_COMPILE_FEATURES");

  if (!cmNonempty(featuresKnown)) {
    std::ostringstream e;
    if (error) {
      e << "no";
    } else {
      e << "No";
    }
    e << " known features for " << lang << " compiler\n\""
      << this->Makefile->GetSafeDefinition("CMAKE_" + lang + "_COMPILER_ID")
      << "\"\nversion "
      << this->Makefile->GetSafeDefinition("CMAKE_" + lang +
                                           "_COMPILER_VERSION")
      << ".";
    if (error) {
      *error = e.str();
    } else {
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    }
    return nullptr;
  }
  return featuresKnown;
}